

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_hook(lua_State *L,int event,int line)

{
  lua_Hook p_Var1;
  CallInfo *pCVar2;
  StkId pTVar3;
  StkId pTVar4;
  undefined1 local_b8 [8];
  lua_Debug ar;
  ptrdiff_t ci_top;
  ptrdiff_t top;
  CallInfo *ci;
  lua_Hook hook;
  int line_local;
  int event_local;
  lua_State *L_local;
  
  p_Var1 = L->hook;
  if ((p_Var1 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pCVar2 = L->ci;
    pTVar3 = L->top;
    pTVar4 = L->stack;
    ar.i_ci = (CallInfo *)((long)pCVar2->top - (long)L->stack);
    local_b8._0_4_ = event;
    ar.source._0_4_ = line;
    ar._112_8_ = pCVar2;
    if ((long)L->stack_last - (long)L->top >> 4 < 0x15) {
      luaD_growstack(L,0x14);
    }
    pCVar2->top = L->top + 0x14;
    L->allowhook = '\0';
    pCVar2->callstatus = pCVar2->callstatus | 4;
    (*p_Var1)(L,(lua_Debug *)local_b8);
    L->allowhook = '\x01';
    pCVar2->top = (StkId)((long)&(ar.i_ci)->func + (long)&L->stack->value_);
    L->top = (StkId)((long)L->stack + ((long)pTVar3 - (long)pTVar4));
    pCVar2->callstatus = pCVar2->callstatus & 0xfb;
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top);
    ptrdiff_t ci_top = savestack(L, ci->top);
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    ci->top = L->top + LUA_MINSTACK;
    lua_assert(ci->top <= L->stack_last);
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= CIST_HOOKED;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top = restorestack(L, ci_top);
    L->top = restorestack(L, top);
    ci->callstatus &= ~CIST_HOOKED;
  }
}